

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

ssize_t __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
::write(basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
        *this,int __fd,void *__buf,size_t __n)

{
  ostream_iterator<char,_char,_std::char_traits<char>_> *in_RAX;
  undefined4 in_register_00000034;
  long lVar1;
  char *__value;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_38;
  
  __value = (char *)CONCAT44(in_register_00000034,__fd);
  local_38._M_stream = (this->out_)._M_stream;
  local_38._M_string = (this->out_)._M_string;
  if (0 < (long)__buf) {
    lVar1 = (long)__buf + 1;
    do {
      in_RAX = std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                         (&local_38,__value);
      __value = __value + 1;
      lVar1 = lVar1 + -1;
    } while (1 < lVar1);
  }
  (this->out_)._M_stream = local_38._M_stream;
  (this->out_)._M_string = local_38._M_string;
  return (ssize_t)in_RAX;
}

Assistant:

void write(string_view value) {
    auto &&it = reserve(value.size());
    it = internal::copy_str<char_type>(value.begin(), value.end(), it);
  }